

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_strategy.h
# Opt level: O0

int32_t __thiscall charls::decoder_strategy::read_value(decoder_strategy *this,int32_t length)

{
  ulong uVar1;
  bool bVar2;
  int32_t result;
  int32_t length_local;
  decoder_strategy *this_local;
  
  if ((this->valid_bits_ < length) && (fill_read_cache(this), this->valid_bits_ < length)) {
    impl::throw_jpegls_error(InvalidCompressedData);
  }
  bVar2 = false;
  if (length != 0) {
    bVar2 = length <= this->valid_bits_;
  }
  if (bVar2) {
    if (0x1f < length) {
      __assert_fail("length < 32",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/cornerstonejs[P]charls/src/decoder_strategy.h"
                    ,0x6f,"int32_t charls::decoder_strategy::read_value(const int32_t)");
    }
    uVar1 = this->read_cache_;
    skip(this,length);
    return (int32_t)(uVar1 >> (0x40U - (char)length & 0x3f));
  }
  __assert_fail("length != 0 && length <= valid_bits_",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/cornerstonejs[P]charls/src/decoder_strategy.h"
                ,0x6e,"int32_t charls::decoder_strategy::read_value(const int32_t)");
}

Assistant:

FORCE_INLINE int32_t read_value(const int32_t length)
    {
        if (valid_bits_ < length)
        {
            fill_read_cache();
            if (UNLIKELY(valid_bits_ < length))
                impl::throw_jpegls_error(jpegls_errc::invalid_encoded_data);
        }

        ASSERT(length != 0 && length <= valid_bits_);
        ASSERT(length < 32);
        const auto result{static_cast<int32_t>(read_cache_ >> (cache_t_bit_count - length))};
        skip(length);
        return result;
    }